

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# part_attr.c
# Opt level: O0

exr_result_t
exr_set_tile_descriptor
          (exr_context_t ctxt,int part_index,uint32_t x_size,uint32_t y_size,
          exr_tile_level_mode_t level_mode,exr_tile_round_mode_t round_mode)

{
  long lVar1;
  exr_result_t eVar2;
  undefined4 in_ECX;
  undefined4 in_EDX;
  int in_ESI;
  char *in_RDI;
  byte in_R8B;
  char in_R9B;
  int32_t unaff_retaddr;
  exr_attribute_type_t unaff_retaddr_00;
  char *in_stack_00000008;
  exr_priv_part_t part;
  exr_attribute_t *attr;
  exr_result_t rv;
  int in_stack_0000004c;
  exr_priv_part_t in_stack_00000050;
  exr_context_t in_stack_00000058;
  exr_const_context_t in_stack_ffffffffffffffc0;
  int local_28;
  undefined4 in_stack_fffffffffffffff8;
  undefined4 in_stack_fffffffffffffffc;
  
  local_28 = 0;
  if (in_RDI == (char *)0x0) {
    local_28 = 2;
  }
  else {
    internal_exr_lock(in_stack_ffffffffffffffc0);
    if ((in_ESI < 0) || (*(int *)(in_RDI + 0xc4) <= in_ESI)) {
      internal_exr_unlock(in_stack_ffffffffffffffc0);
      local_28 = (**(code **)(in_RDI + 0x48))(in_RDI,4,"Part index (%d) out of range",in_ESI);
    }
    else {
      lVar1 = *(long *)(*(long *)(in_RDI + 0x1d8) + (long)in_ESI * 8);
      if (*in_RDI == '\0') {
        internal_exr_unlock(in_stack_ffffffffffffffc0);
        local_28 = (**(code **)(in_RDI + 0x38))(in_RDI,8);
      }
      else if (*in_RDI == '\x03') {
        internal_exr_unlock(in_stack_ffffffffffffffc0);
        local_28 = (**(code **)(in_RDI + 0x38))(in_RDI,0x15);
      }
      else if ((*(int *)(lVar1 + 4) == 0) || (*(int *)(lVar1 + 4) == 2)) {
        internal_exr_unlock(in_stack_ffffffffffffffc0);
        local_28 = (**(code **)(in_RDI + 0x40))
                             (in_RDI,0x13,"Attempt to set tile descriptor on scanline part");
      }
      else {
        if (*(long *)(lVar1 + 0x60) == 0) {
          local_28 = exr_attr_list_add((exr_context_t)attr,(exr_attribute_list_t *)part,
                                       in_stack_00000008,unaff_retaddr_00,unaff_retaddr,
                                       (uint8_t **)
                                       CONCAT44(in_stack_fffffffffffffffc,in_stack_fffffffffffffff8)
                                       ,(exr_attribute_t **)CONCAT44(part_index,x_size));
        }
        else if (*(int *)(*(long *)(lVar1 + 0x60) + 0x14) != 0x15) {
          internal_exr_unlock(in_stack_ffffffffffffffc0);
          eVar2 = (**(code **)(in_RDI + 0x48))
                            (in_RDI,6,"Invalid required attribute type \'%s\' for \'%s\'",
                             *(undefined8 *)(*(long *)(lVar1 + 0x60) + 8),"tiles");
          return eVar2;
        }
        lVar1 = *(long *)(lVar1 + 0x60);
        if (local_28 == 0) {
          **(undefined4 **)(lVar1 + 0x18) = in_EDX;
          *(undefined4 *)(*(long *)(lVar1 + 0x18) + 4) = in_ECX;
          *(byte *)(*(long *)(lVar1 + 0x18) + 8) = in_R9B << 4 | in_R8B & 0xf;
          local_28 = internal_exr_compute_tile_information
                               (in_stack_00000058,in_stack_00000050,in_stack_0000004c);
        }
        internal_exr_unlock(in_stack_ffffffffffffffc0);
      }
    }
  }
  return local_28;
}

Assistant:

exr_result_t
exr_set_tile_descriptor (
    exr_context_t         ctxt,
    int                   part_index,
    uint32_t              x_size,
    uint32_t              y_size,
    exr_tile_level_mode_t level_mode,
    exr_tile_round_mode_t round_mode)
{
    exr_result_t     rv   = EXR_ERR_SUCCESS;
    exr_attribute_t* attr = NULL;
    EXR_LOCK_AND_DEFINE_PART (part_index);
    if (ctxt->mode == EXR_CONTEXT_READ)
        return EXR_UNLOCK_AND_RETURN (
            ctxt->standard_error (ctxt, EXR_ERR_NOT_OPEN_WRITE));
    if (ctxt->mode == EXR_CONTEXT_WRITING_DATA)
        return EXR_UNLOCK_AND_RETURN (
            ctxt->standard_error (ctxt, EXR_ERR_ALREADY_WROTE_ATTRS));
    if (part->storage_mode == EXR_STORAGE_SCANLINE ||
        part->storage_mode == EXR_STORAGE_DEEP_SCANLINE)
        return EXR_UNLOCK_AND_RETURN (ctxt->report_error (
            ctxt,
            EXR_ERR_TILE_SCAN_MIXEDAPI,
            "Attempt to set tile descriptor on scanline part"));

    if (!part->tiles)
    {
        rv = exr_attr_list_add (
            ctxt,
            &(part->attributes),
            "tiles",
            EXR_ATTR_TILEDESC,
            0,
            NULL,
            &(part->tiles));
    }
    else if (part->tiles->type != EXR_ATTR_TILEDESC)
    {
        return EXR_UNLOCK_AND_RETURN (ctxt->print_error (
            ctxt,
            EXR_ERR_FILE_BAD_HEADER,
            "Invalid required attribute type '%s' for '%s'",
            part->tiles->type_name,
            "tiles"));
    }

    attr = part->tiles;

    if (rv == EXR_ERR_SUCCESS)
    {
        attr->tiledesc->x_size = x_size;
        attr->tiledesc->y_size = y_size;
        attr->tiledesc->level_and_round =
            EXR_PACK_TILE_LEVEL_ROUND (level_mode, round_mode);

        rv = internal_exr_compute_tile_information (ctxt, part, 1);
    }

    return EXR_UNLOCK_AND_RETURN (rv);
}